

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O1

void av1_set_speed_features_framesize_independent(AV1_COMP *cpi,int speed)

{
  INTER_MODE_SPEED_FEATURES *pIVar1;
  int *piVar2;
  uint *puVar3;
  undefined8 *puVar4;
  int16_t *piVar5;
  MESH_PATTERN *pMVar6;
  MODE MVar7;
  byte bVar8;
  FRAME_TYPE FVar9;
  _Bool _Var10;
  _Bool _Var11;
  aom_enc_pass aVar12;
  AV1_PRIMARY *pAVar13;
  SequenceHeader *pSVar14;
  MESH_PATTERN MVar15;
  uint auVar16 [2];
  undefined1 auVar17 [16];
  TRELLIS_OPT_TYPE TVar18;
  long lVar19;
  bool bVar20;
  int i;
  int iVar21;
  int iVar22;
  ulong uVar23;
  code *pcVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  byte bVar28;
  uint uVar29;
  int iVar30;
  bool bVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  long lVar38;
  
  (cpi->sf).hl_sf.frame_parameter_update = 1;
  (cpi->sf).hl_sf.recode_loop = '\x02';
  (cpi->sf).hl_sf.recode_tolerance = 0x19;
  (cpi->sf).hl_sf.high_precision_mv_usage = '\x01';
  (cpi->sf).hl_sf.superres_auto_search_type = '\0';
  (cpi->sf).hl_sf.disable_extra_sc_testing = 0;
  (cpi->sf).hl_sf.second_alt_ref_filtering = 1;
  (cpi->sf).hl_sf.adjust_num_frames_for_arf_filtering = 0;
  (cpi->sf).hl_sf.accurate_bit_estimate = 0;
  (cpi->sf).hl_sf.weight_calc_level_in_tf = 0;
  (cpi->sf).hl_sf.allow_sub_blk_me_in_tf = 0;
  *(undefined8 *)&(cpi->sf).hl_sf.disable_ref_frame_mvs = 0x300000000;
  (cpi->sf).tpl_sf.prune_starting_mv = 0;
  (cpi->sf).fp_sf.skip_motion_search_threshold = 0;
  (cpi->sf).fp_sf.disable_recon = 0;
  *(undefined8 *)&(cpi->sf).fp_sf.skip_zeromv_motion_search = 0;
  *(undefined8 *)((long)&(cpi->sf).tpl_sf.gop_length_decision_method + 1) = 0;
  *(undefined8 *)((long)&(cpi->sf).tpl_sf.reduce_first_step_size + 1) = 0;
  (cpi->sf).tpl_sf.search_method = '\x01';
  (cpi->sf).tpl_sf.prune_ref_frames_in_tpl = 0;
  (cpi->sf).tpl_sf.allow_compound_pred = 1;
  (cpi->sf).gm_sf.prune_ref_frame_for_gm_search = 0;
  (cpi->sf).gm_sf.prune_zero_mv_with_sse = 0;
  (cpi->sf).gm_sf.disable_gm_search_based_on_stats = 0;
  (cpi->sf).gm_sf.downsample_level = 0;
  (cpi->sf).tpl_sf.use_y_only_rate_distortion = 0;
  (cpi->sf).tpl_sf.use_sad_for_mode_decision = 0;
  *(undefined8 *)((long)&(cpi->sf).tpl_sf.use_sad_for_mode_decision + 1) = 0;
  (cpi->sf).gm_sf.num_refinement_steps = 5;
  (cpi->sf).gm_sf.gm_erroradv_tr_level = 0;
  (cpi->sf).part_sf.partition_search_type = '\0';
  (cpi->sf).part_sf.less_rectangular_check_level = 0;
  (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
  (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\0';
  (cpi->sf).part_sf.default_min_partition_size = BLOCK_4X4;
  (cpi->sf).part_sf.default_max_partition_size = BLOCK_128X128;
  (cpi->sf).part_sf.adjust_var_based_rd_partitioning = 0;
  (cpi->sf).part_sf.max_intra_bsize = BLOCK_128X128;
  (cpi->sf).part_sf.fixed_partition_size = BLOCK_16X16;
  (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0;
  (cpi->sf).part_sf.partition_search_breakout_rate_thr = 0;
  (cpi->sf).part_sf.prune_ext_partition_types_search_level = 0;
  (cpi->sf).part_sf.prune_part4_search = 0;
  (cpi->sf).part_sf.ml_prune_partition = 0;
  (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
  (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = -1;
  (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = -1;
  (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = -1;
  (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = -1;
  (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
  (cpi->sf).part_sf.intra_cnn_based_part_prune_level = 0;
  (cpi->sf).part_sf.simple_motion_search_prune_agg = 0;
  (cpi->sf).part_sf.simple_motion_search_prune_rect = 0;
  (cpi->sf).part_sf.simple_motion_search_split = 0;
  (cpi->sf).part_sf.simple_motion_search_early_term_none = 0;
  (cpi->sf).part_sf.simple_motion_search_reduce_search_steps = 0;
  (cpi->sf).part_sf.ext_partition_eval_thresh = BLOCK_8X8;
  (cpi->sf).part_sf.ext_part_eval_based_on_cur_best = 0;
  (cpi->sf).part_sf.rect_partition_eval_thresh = 0xf;
  (cpi->sf).part_sf.prune_ext_part_using_split_info = 0;
  (cpi->sf).part_sf.prune_rectangular_split_based_on_qidx = 0;
  (cpi->sf).part_sf.prune_rect_part_using_4x4_var_deviation = false;
  (cpi->sf).part_sf.prune_rect_part_using_none_pred_mode = false;
  (cpi->sf).part_sf.early_term_after_none_split = 0;
  (cpi->sf).part_sf.ml_predict_breakout_level = 0;
  (cpi->sf).part_sf.prune_sub_8x8_partition_level = 0;
  (cpi->sf).part_sf.simple_motion_search_rect_split = 0;
  (cpi->sf).part_sf.reuse_prev_rd_results_for_part_ab = 0;
  (cpi->sf).part_sf.reuse_best_prediction_for_part_ab = 0;
  (cpi->sf).part_sf.use_best_rd_for_pruning = 0;
  (cpi->sf).part_sf.skip_non_sq_part_based_on_none = 0;
  (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 0;
  (cpi->sf).mv_sf.auto_mv_step_size = 0;
  (cpi->sf).mv_sf.exhaustive_searches_thresh = 0;
  (cpi->sf).mv_sf.obmc_full_pixel_search_level = 0;
  (cpi->sf).mv_sf.full_pixel_search_level = 0;
  (cpi->sf).mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_DISABLED;
  (cpi->sf).mv_sf.use_fullpel_costlist = 0;
  (cpi->sf).mv_sf.reduce_search_range = 0;
  (cpi->sf).mv_sf.search_method = '\x01';
  (cpi->sf).mv_sf.subpel_force_stop = '\0';
  (cpi->sf).mv_sf.simple_motion_subpel_force_stop = '\0';
  (cpi->sf).mv_sf.subpel_iters_per_step = 2;
  (cpi->sf).mv_sf.subpel_search_method = '\0';
  (cpi->sf).mv_sf.use_accurate_subpel_search = '\x03';
  (cpi->sf).mv_sf.use_bsize_dependent_search_method = 0;
  (cpi->sf).mv_sf.use_downsampled_sad = 0;
  (cpi->sf).mv_sf.disable_extensive_joint_motion_search = 0;
  (cpi->sf).mv_sf.disable_second_mv = 0;
  (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = 0;
  (cpi->sf).mv_sf.warp_search_method = '\x01';
  (cpi->sf).mv_sf.warp_search_iters = 8;
  (cpi->sf).mv_sf.use_intrabc = 1;
  pIVar1 = &(cpi->sf).inter_sf;
  (cpi->sf).inter_sf.model_based_post_interp_filter_breakout = 0;
  (cpi->sf).inter_sf.reduce_inter_modes = 0;
  (cpi->sf).inter_sf.adaptive_rd_thresh = 0;
  (cpi->sf).inter_sf.fast_wedge_sign_estimate = 0;
  (cpi->sf).inter_sf.use_dist_wtd_comp_flag = '\0';
  (cpi->sf).inter_sf.reuse_inter_intra_mode = 0;
  (cpi->sf).inter_sf.selective_ref_frame = 0;
  (cpi->sf).inter_sf.prune_ref_frame_for_rect_partitions = 0;
  (cpi->sf).inter_sf.alt_ref_search_fp = 0;
  (cpi->sf).inter_sf.prune_single_ref = 0;
  (cpi->sf).inter_sf.prune_comp_ref_frames = 0;
  (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SB;
  (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SB;
  (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SB;
  (cpi->sf).inter_sf.prune_inter_modes_based_on_tpl = 0;
  (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\0';
  (cpi->sf).inter_sf.skip_repeated_ref_mv = 0;
  (cpi->sf).inter_sf.skip_newmv_in_drl = 0;
  (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search = 0;
  (cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma = 0;
  (cpi->sf).inter_sf.prune_inter_modes_if_skippable = 0;
  (cpi->sf).inter_sf.inter_mode_rd_model_estimation = 0;
  (cpi->sf).inter_sf.txfm_rd_gate_level[0] = 0;
  (cpi->sf).inter_sf.txfm_rd_gate_level[1] = 0;
  (cpi->sf).inter_sf.txfm_rd_gate_level[2] = 0;
  (cpi->sf).inter_sf.prune_warped_prob_thresh = 0;
  (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0;
  (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0;
  (cpi->sf).inter_sf.fast_interintra_wedge_search = 0;
  (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight = 0;
  (cpi->sf).inter_sf.prune_ref_mv_idx_search = 0;
  (cpi->sf).inter_sf.disable_onesided_comp = 0;
  (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0;
  (cpi->sf).inter_sf.prune_compound_using_single_ref = 0;
  (cpi->sf).inter_sf.prune_ext_comp_using_neighbors = 0;
  (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 0;
  (cpi->sf).inter_sf.prune_comp_using_best_single_mode_ref = 0;
  (cpi->sf).inter_sf.prune_comp_type_by_model_rd = 0;
  (cpi->sf).inter_sf.prune_comp_type_by_comp_avg = 0;
  (cpi->sf).inter_sf.prune_comp_search_by_single_result = 0;
  (cpi->sf).inter_sf.prune_mode_search_simple_translation = 0;
  (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 0;
  (cpi->sf).inter_sf.inter_mode_txfm_breakout = 0;
  (cpi->sf).inter_sf.limit_inter_mode_cands = 0;
  (cpi->sf).inter_sf.limit_txfm_eval_per_mode = 0;
  (cpi->sf).inter_sf.reuse_compound_type_decision = 0;
  (cpi->sf).inter_sf.disable_masked_comp = 0;
  (cpi->sf).inter_sf.enable_fast_compound_mode_search = 0;
  (cpi->sf).inter_sf.reuse_mask_search_results = 0;
  (cpi->sf).interp_sf.skip_sharp_interp_filter_search = 0;
  (cpi->sf).interp_sf.cb_pred_filter_search = 0;
  (cpi->sf).interp_sf.adaptive_interp_filter_search = 0;
  (cpi->sf).interp_sf.skip_interp_filter_search = 0;
  *(undefined8 *)&(cpi->sf).inter_sf.skip_arf_compound = 0;
  (cpi->sf).interp_sf.disable_dual_filter = 0;
  (cpi->sf).interp_sf.use_interp_filter = 0;
  (cpi->sf).intra_sf.dv_cost_upd_level = INTERNAL_COST_UPD_SB;
  (cpi->sf).intra_sf.skip_intra_in_interframe = 1;
  (cpi->sf).intra_sf.intra_pruning_with_hog = 0;
  (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 0;
  (cpi->sf).intra_sf.prune_palette_search_level = 0;
  (cpi->sf).intra_sf.prune_luma_palette_size_search_level = 0;
  lVar19 = 0x182d7;
  do {
    *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar19 * 4) =
         0x1fff;
    piVar5 = (cpi->enc_quant_dequant_params).quants.y_quant[0] + lVar19 * 2 + 2;
    piVar5[0] = 0x3fff;
    piVar5[1] = 0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x182dc);
  TVar18 = '\0';
  (cpi->sf).intra_sf.disable_smooth_intra = 0;
  (cpi->sf).intra_sf.prune_smooth_intra_mode_for_chroma = false;
  (cpi->sf).intra_sf.prune_filter_intra_level = 0;
  (cpi->sf).intra_sf.prune_chroma_modes_using_luma_winner = 0;
  (cpi->sf).intra_sf.cfl_search_range = 3;
  (cpi->sf).intra_sf.top_intra_model_count_allowed = 4;
  (cpi->sf).tx_sf.model_based_prune_tx_search_level = 0;
  (cpi->sf).intra_sf.adapt_top_model_rd_count_using_neighbors = 0;
  (cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra = 0;
  (cpi->sf).intra_sf.early_term_chroma_palette_size_search = 0;
  (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames = 0;
  (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr = 0;
  (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect = 0;
  (cpi->sf).tx_sf.intra_tx_size_search_init_depth_sqr = 0;
  (cpi->sf).tx_sf.intra_tx_size_search_init_depth_rect = 0;
  (cpi->sf).tx_sf.tx_size_search_lgr_block = 0;
  (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x01';
  (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh = 0x2134;
  (cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search = 0;
  (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh = 0x7fffffff;
  (cpi->sf).tx_sf.tx_type_search.use_reduced_intra_txset = 0;
  (cpi->sf).tx_sf.tx_type_search.use_skip_flag_prediction = 1;
  (cpi->sf).tx_sf.tx_type_search.skip_tx_search = 0;
  (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 0;
  (cpi->sf).tx_sf.tx_type_search.prune_tx_type_est_rd = 0;
  (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 0;
  (cpi->sf).tx_sf.txb_split_cap = 1;
  (cpi->sf).tx_sf.adaptive_txb_search_level = 0;
  (cpi->sf).tx_sf.refine_fast_tx_search_results = 1;
  (cpi->sf).tx_sf.prune_tx_size_level = 0;
  (cpi->sf).tx_sf.prune_intra_tx_depths_using_nn = false;
  (cpi->sf).tx_sf.use_rd_based_breakout_for_intra_tx_search = false;
  switch((cpi->oxcf).algo_cfg.disable_trellis_quant) {
  case 0:
    if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
      TVar18 = '\0';
    }
    else {
      TVar18 = '\x01';
    }
    break;
  case 1:
    break;
  case 2:
    TVar18 = '\x02';
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      TVar18 = ((cpi->oxcf).rc_cfg.worst_allowed_q != 0) * '\x02';
    }
    break;
  case 3:
    TVar18 = '\x03';
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      TVar18 = ((cpi->oxcf).rc_cfg.worst_allowed_q != 0) * '\x03';
    }
    break;
  default:
    goto switchD_00227acf_default;
  }
  (cpi->sf).rd_sf.optimize_coefficients = TVar18;
switchD_00227acf_default:
  (cpi->sf).rd_sf.simple_model_rd_from_var = 0;
  (cpi->sf).rd_sf.tx_domain_dist_level = 0;
  (cpi->sf).rd_sf.tx_domain_dist_thres_level = 0;
  (cpi->sf).winner_mode_sf.motion_mode_for_winner_cand = 0;
  (cpi->sf).winner_mode_sf.dc_blk_pred_level = 0;
  (cpi->sf).winner_mode_sf.winner_mode_ifs = 0;
  (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = 0;
  (cpi->sf).rd_sf.use_mb_rd_hash = 0;
  (cpi->sf).rd_sf.perform_coeff_opt = 0;
  (cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt = 0;
  (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 0;
  *(undefined8 *)((long)&(cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt + 1) = 0;
  *(undefined8 *)((long)&(cpi->sf).winner_mode_sf.tx_size_search_level + 1) = 0;
  (cpi->sf).lpf_sf.disable_loop_restoration_chroma = 0;
  (cpi->sf).lpf_sf.disable_loop_restoration_luma = 0;
  (cpi->sf).lpf_sf.min_lr_unit_size = 0x40;
  (cpi->sf).lpf_sf.max_lr_unit_size = 0x100;
  (cpi->sf).lpf_sf.lpf_pick = '\0';
  (cpi->sf).lpf_sf.use_coarse_filter_level_search = 0;
  (cpi->sf).lpf_sf.adaptive_luma_loop_filter_skip = 0;
  (cpi->sf).lpf_sf.skip_loop_filter_using_filt_error = 0;
  (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FULL_SEARCH;
  (cpi->sf).lpf_sf.dual_sgr_penalty_level = 0;
  (cpi->sf).lpf_sf.enable_sgr_ep_pruning = 0;
  (cpi->sf).lpf_sf.prune_wiener_based_on_src_var = 0;
  (cpi->sf).lpf_sf.prune_sgr_based_on_wiener = 0;
  *(undefined8 *)((long)&(cpi->sf).lpf_sf.prune_sgr_based_on_wiener + 3) = 0;
  *(undefined8 *)&(cpi->sf).lpf_sf.use_downsampled_wiener_stats = 0;
  (cpi->sf).rt_sf.skip_intra_pred = 0;
  (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
  (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 0;
  (cpi->sf).rt_sf.nonrd_check_partition_split = 0;
  (cpi->sf).rt_sf.mode_search_skip_flags = 0;
  (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 0;
  (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 0;
  (cpi->sf).rt_sf.use_nonrd_pick_mode = 0;
  (cpi->sf).rt_sf.use_nonrd_altref_frame = 0;
  (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
  (cpi->sf).rt_sf.use_real_time_ref_set = 0;
  (cpi->sf).rt_sf.short_circuit_low_temp_var = 0;
  (cpi->sf).rt_sf.reuse_inter_pred_nonrd = 0;
  (cpi->sf).rt_sf.num_inter_modes_for_tx_search = 0x7fffffff;
  (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
  (cpi->sf).rt_sf.use_simple_rd_model = 0;
  (cpi->sf).rt_sf.hybrid_intra_pickmode = 0;
  (cpi->sf).rt_sf.prune_palette_search_nonrd = 0;
  *(undefined8 *)((long)&(cpi->sf).rt_sf.prune_palette_search_nonrd + 1) = 0;
  (cpi->sf).rt_sf.use_temporal_noise_estimate = 0;
  (cpi->sf).rt_sf.fullpel_search_step_param = 0;
  (cpi->sf).rt_sf.check_scene_detection = 0;
  (cpi->sf).rt_sf.rc_adjust_keyframe = 0;
  (cpi->sf).rt_sf.rc_compute_spatial_var_sc = 0;
  (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
  lVar19 = 0x18342;
  do {
    puVar4 = (undefined8 *)
             ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar19 * 4);
    *puVar4 = 0x1fff00001fff;
    puVar4[1] = 0x1fff00001fff;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x18352);
  (cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad = false;
  (cpi->sf).rt_sf.nonrd_aggressive_skip = 0;
  (cpi->sf).rt_sf.skip_cdef_sb = 0;
  (cpi->sf).rt_sf.force_large_partition_blocks_intra = 0;
  (cpi->sf).rt_sf.skip_tx_no_split_var_based_partition = 0;
  (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 0;
  (cpi->sf).rt_sf.gf_length_lvl = 0;
  (cpi->sf).rt_sf.prune_inter_modes_with_golden_ref = 0;
  (cpi->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 0;
  (cpi->sf).rt_sf.prune_inter_modes_using_temp_var = 0;
  (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
  (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 0;
  (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_4X4;
  (cpi->sf).rt_sf.var_part_split_threshold_shift = 7;
  (cpi->sf).rt_sf.var_part_based_on_qidx = 0;
  (cpi->sf).rt_sf.sse_early_term_inter_search = EARLY_TERM_DISABLED;
  (cpi->sf).rt_sf.gf_refresh_based_on_qp = 0;
  (cpi->sf).rt_sf.use_rtc_tf = 0;
  (cpi->sf).rt_sf.use_idtx_nonrd = 0;
  (cpi->sf).rt_sf.prune_idtx_nonrd = 0;
  (cpi->sf).rt_sf.dct_only_palette_nonrd = 0;
  (cpi->sf).rt_sf.skip_lf_screen = 0;
  (cpi->sf).rt_sf.thresh_active_maps_skip_lf_cdef = 100;
  (cpi->sf).rt_sf.part_early_exit_zeromv = 0;
  (cpi->sf).rt_sf.sad_based_adp_altref_lag = 0;
  (cpi->sf).rt_sf.partition_direct_merging = 0;
  *(undefined8 *)((long)&(cpi->sf).rt_sf.partition_direct_merging + 1) = 0;
  (cpi->sf).rt_sf.prune_compoundmode_with_singlecompound_var = false;
  (cpi->sf).rt_sf.frame_level_mode_cost_update = false;
  (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far = false;
  (cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors = false;
  (cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far = false;
  (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = false;
  (cpi->sf).rt_sf.disable_cdf_update_non_reference_frame = false;
  (cpi->sf).rt_sf.prune_compoundmode_with_singlemode_var = false;
  (cpi->sf).rt_sf.skip_compound_based_on_var = false;
  (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad = 1;
  (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
  (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh = 0;
  (cpi->sf).rt_sf.enable_ref_short_signaling = false;
  (cpi->sf).rt_sf.check_globalmv_on_single_ref = true;
  (cpi->sf).rt_sf.increase_color_thresh_palette = false;
  (cpi->sf).rt_sf.selective_cdf_update = 0;
  (cpi->sf).rt_sf.force_only_last_ref = 0;
  (cpi->sf).rt_sf.higher_thresh_scene_detection = 1;
  (cpi->sf).rt_sf.skip_newmv_flat_blocks_screen = 0;
  (cpi->sf).rt_sf.skip_encoding_non_reference_slide_change = 0;
  (cpi->sf).rt_sf.rc_faster_convergence_static = 0;
  (cpi->sf).rt_sf.skip_newmv_mode_sad_screen = 0;
  MVar7 = (cpi->oxcf).mode;
  if (MVar7 == '\x02') {
    _Var10 = (cpi->common).features.allow_screen_content_tools;
    uVar29 = (uint)(cpi->oxcf).use_highbitdepth;
    (cpi->sf).part_sf.less_rectangular_check_level = 1;
    (cpi->sf).part_sf.ml_prune_partition = 1;
    (cpi->sf).part_sf.prune_ext_partition_types_search_level = 1;
    (cpi->sf).part_sf.prune_part4_search = 2;
    (cpi->sf).part_sf.simple_motion_search_prune_rect = 1;
    (cpi->sf).part_sf.ml_predict_breakout_level = (uVar29 ^ 1) * 2 | 1;
    (cpi->sf).part_sf.reuse_prev_rd_results_for_part_ab = 1;
    (cpi->sf).part_sf.use_best_rd_for_pruning = 1;
    (cpi->sf).intra_sf.intra_pruning_with_hog = 1;
    (cpi->sf).intra_sf.prune_luma_palette_size_search_level = 1;
    (cpi->sf).intra_sf.dv_cost_upd_level = INTERNAL_COST_UPD_OFF;
    (cpi->sf).intra_sf.early_term_chroma_palette_size_search = 1;
    (cpi->sf).tx_sf.adaptive_txb_search_level = 1;
    (cpi->sf).tx_sf.model_based_prune_tx_search_level = 1;
    (cpi->sf).tx_sf.intra_tx_size_search_init_depth_sqr = 1;
    (cpi->sf).tx_sf.tx_type_search.use_reduced_intra_txset = 1;
    (cpi->sf).rt_sf.use_nonrd_pick_mode = 0;
    (cpi->sf).rt_sf.use_real_time_ref_set = 0;
    iVar21 = 0x100000;
    if (((cpi->twopass_frame).fr_content_type != '\x01') &&
       (iVar21 = 0x100000, cpi->use_screen_content_tools == 0)) {
      iVar21 = 0x2000000;
    }
    (cpi->sf).mv_sf.exhaustive_searches_thresh = iVar21;
    (cpi->sf).rd_sf.perform_coeff_opt = 1;
    (cpi->sf).hl_sf.superres_auto_search_type = '\x01';
    if (0 < speed) {
      (cpi->sf).part_sf.intra_cnn_based_part_prune_level = (uint)(_Var10 ^ 1) * 2;
      (cpi->sf).part_sf.simple_motion_search_early_term_none = 1;
      (cpi->sf).part_sf.simple_motion_search_split = 2 - (uint)_Var10;
      (cpi->sf).part_sf.ml_predict_breakout_level = uVar29 ^ 3;
      (cpi->sf).part_sf.reuse_best_prediction_for_part_ab = 1;
      piVar2 = &(cpi->sf).mv_sf.exhaustive_searches_thresh;
      *piVar2 = *piVar2 << 1;
      (cpi->sf).intra_sf.prune_palette_search_level = 1;
      (cpi->sf).intra_sf.prune_luma_palette_size_search_level = 2;
      (cpi->sf).intra_sf.top_intra_model_count_allowed = 3;
      (cpi->sf).tx_sf.adaptive_txb_search_level = 2;
      (cpi->sf).tx_sf.model_based_prune_tx_search_level = 0;
      (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr = 1;
      (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect = 1;
      (cpi->sf).tx_sf.intra_tx_size_search_init_depth_rect = 1;
      (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
      (cpi->sf).tx_sf.tx_type_search.skip_tx_search = 1;
      (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x02';
      (cpi->sf).rd_sf.perform_coeff_opt = 2;
      (cpi->sf).rd_sf.tx_domain_dist_level = 1;
      (cpi->sf).rd_sf.tx_domain_dist_thres_level = 1;
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
      (cpi->sf).lpf_sf.dual_sgr_penalty_level = 1;
      (cpi->sf).lpf_sf.enable_sgr_ep_pruning = 1;
    }
    if (1 < speed) {
      (cpi->sf).mv_sf.auto_mv_step_size = 1;
      (cpi->sf).intra_sf.disable_smooth_intra = 1;
      (cpi->sf).intra_sf.intra_pruning_with_hog = 2;
      (cpi->sf).intra_sf.prune_filter_intra_level = 1;
      (cpi->sf).rd_sf.perform_coeff_opt = 3;
      (cpi->sf).lpf_sf.prune_wiener_based_on_src_var = 1;
      (cpi->sf).lpf_sf.prune_sgr_based_on_wiener = 1;
    }
    if (2 < speed) {
      (cpi->sf).hl_sf.high_precision_mv_usage = '\x01';
      (cpi->sf).hl_sf.recode_loop = '\x01';
      (cpi->sf).part_sf.less_rectangular_check_level = 2;
      (cpi->sf).part_sf.simple_motion_search_prune_agg = 1;
      (cpi->sf).part_sf.prune_ext_part_using_split_info = 1;
      (cpi->sf).mv_sf.full_pixel_search_level = 1;
      (cpi->sf).mv_sf.search_method = '\0';
      (cpi->sf).intra_sf.intra_pruning_with_hog = 3;
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 2;
      (cpi->sf).intra_sf.prune_palette_search_level = 2;
      (cpi->sf).tx_sf.adaptive_txb_search_level = 2;
      (cpi->sf).tx_sf.tx_type_search.use_skip_flag_prediction = 2;
      (cpi->sf).tx_sf.use_rd_based_breakout_for_intra_tx_search = true;
      (cpi->sf).lpf_sf.prune_sgr_based_on_wiener = 2 - (uint)_Var10;
      (cpi->sf).lpf_sf.disable_loop_restoration_chroma = 0;
      (cpi->sf).lpf_sf.reduce_wiener_window_size = 1;
      (cpi->sf).lpf_sf.prune_wiener_based_on_src_var = 2;
    }
    if (3 < speed) {
      (cpi->sf).mv_sf.subpel_search_method = '\x02';
      (cpi->sf).part_sf.simple_motion_search_prune_agg = 2;
      (cpi->sf).part_sf.simple_motion_search_reduce_search_steps = 4;
      (cpi->sf).part_sf.prune_ext_part_using_split_info = 2;
      (cpi->sf).part_sf.early_term_after_none_split = 1;
      (cpi->sf).part_sf.ml_predict_breakout_level = 3;
      (cpi->sf).intra_sf.prune_chroma_modes_using_luma_winner = 1;
      (cpi->sf).mv_sf.simple_motion_subpel_force_stop = '\x02';
      (cpi->sf).tpl_sf.prune_starting_mv = 2;
      (cpi->sf).tpl_sf.subpel_force_stop = '\x02';
      (cpi->sf).tpl_sf.search_method = '\t';
      (cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search = 1;
      (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x03';
      (cpi->sf).tx_sf.tx_type_search.prune_tx_type_est_rd = 1;
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
      *(undefined8 *)&(cpi->sf).rd_sf.perform_coeff_opt = 0x100000005;
      (cpi->sf).rd_sf.tx_domain_dist_thres_level = 3;
      (cpi->sf).lpf_sf.lpf_pick = '\x01';
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
      (cpi->sf).mv_sf.reduce_search_range = 1;
      (cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist = 1;
      (cpi->sf).winner_mode_sf.multi_winner_mode_type = '\x02';
      (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
    }
    if (4 < speed) {
      (cpi->sf).part_sf.simple_motion_search_prune_agg = 3;
      (cpi->sf).part_sf.ext_partition_eval_thresh = (_Var10 == false) * '\x03' + BLOCK_8X8;
      (cpi->sf).part_sf.intra_cnn_based_part_prune_level = 2 - (uint)_Var10;
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 3;
      (cpi->sf).lpf_sf.use_coarse_filter_level_search = 0;
      (cpi->sf).lpf_sf.disable_wiener_filter = true;
      (cpi->sf).lpf_sf.disable_sgr_filter = true;
      (cpi->sf).mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_LVL_2;
      (cpi->sf).winner_mode_sf.multi_winner_mode_type = '\x01';
    }
    if (5 < speed) {
      (cpi->sf).intra_sf.prune_smooth_intra_mode_for_chroma = true;
      (cpi->sf).intra_sf.prune_filter_intra_level = 2;
      (cpi->sf).intra_sf.intra_pruning_with_hog = 4;
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 4;
      (cpi->sf).intra_sf.cfl_search_range = 1;
      (cpi->sf).intra_sf.top_intra_model_count_allowed = 2;
      (cpi->sf).intra_sf.adapt_top_model_rd_count_using_neighbors = 1;
      (cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra = 1;
      bVar28 = _Var10 ^ 1;
      (cpi->sf).part_sf.prune_rectangular_split_based_on_qidx = (uint)bVar28 + (uint)bVar28;
      (cpi->sf).part_sf.prune_rect_part_using_4x4_var_deviation = true;
      (cpi->sf).part_sf.prune_rect_part_using_none_pred_mode = true;
      (cpi->sf).part_sf.prune_sub_8x8_partition_level = (uint)bVar28;
      (cpi->sf).part_sf.prune_part4_search = 3;
      (cpi->sf).part_sf.default_max_partition_size = BLOCK_32X32;
      (cpi->sf).mv_sf.use_bsize_dependent_search_method = 1;
      (cpi->sf).tx_sf.tx_type_search.prune_tx_type_est_rd = 0;
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
      (cpi->sf).tx_sf.prune_intra_tx_depths_using_nn = true;
      (cpi->sf).rd_sf.perform_coeff_opt = 6;
      (cpi->sf).rd_sf.tx_domain_dist_level = 3;
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
      (cpi->sf).lpf_sf.lpf_pick = '\x03';
      (cpi->sf).winner_mode_sf.multi_winner_mode_type = '\0';
      (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = 1;
      (cpi->sf).winner_mode_sf.dc_blk_pred_level = 1;
    }
    if (6 < speed) {
      (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
      (cpi->sf).part_sf.partition_search_type = '\x02';
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
      puVar3 = &(cpi->sf).rt_sf.mode_search_skip_flags;
      *(byte *)puVar3 = (byte)*puVar3 | 0x10;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 7;
    }
    if (7 < speed) {
      (cpi->sf).rt_sf.hybrid_intra_pickmode = 1;
      (cpi->sf).rt_sf.use_nonrd_pick_mode = 1;
      (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 1;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 8;
      uVar23 = 0;
      do {
        iVar21 = 7;
        if (8 < uVar23) {
          iVar21 = 1;
        }
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar23] = iVar21;
        uVar23 = uVar23 + 1;
      } while (uVar23 != 0x10);
    }
    if (8 < speed) {
      (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
      (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;
      (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 0;
      (cpi->sf).rt_sf.hybrid_intra_pickmode = 0;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 9;
      (cpi->sf).rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var = true;
      (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far = true;
      (cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors = true;
      (cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far = true;
    }
    if ((cpi->sf).intra_sf.prune_chroma_modes_using_luma_winner != 0) {
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 0;
    }
  }
  else if (MVar7 == '\x01') {
    bVar28 = (cpi->common).current_frame.frame_type;
    bVar31 = ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2 &&
             (bVar28 & 0xfd) != 0;
    (cpi->sf).gm_sf.gm_search_type = '\x04';
    (cpi->sf).hl_sf.recode_loop = '\x01';
    (cpi->sf).inter_sf.reuse_inter_intra_mode = 1;
    (cpi->sf).inter_sf.prune_compound_using_single_ref = 0;
    (cpi->sf).inter_sf.prune_comp_type_by_comp_avg = 2;
    (cpi->sf).inter_sf.prune_comp_search_by_single_result = 2;
    (cpi->sf).inter_sf.fast_wedge_sign_estimate = 1;
    (cpi->sf).inter_sf.use_dist_wtd_comp_flag = '\x02';
    (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 100;
    (cpi->sf).interp_sf.cb_pred_filter_search = 0;
    (cpi->sf).interp_sf.skip_interp_filter_search = 1;
    (cpi->sf).part_sf.ml_prune_partition = 1;
    (cpi->sf).part_sf.reuse_prev_rd_results_for_part_ab = 1;
    (cpi->sf).part_sf.prune_ext_partition_types_search_level = 2;
    (cpi->sf).part_sf.less_rectangular_check_level = 2;
    (cpi->sf).mv_sf.obmc_full_pixel_search_level = 1;
    (cpi->sf).intra_sf.dv_cost_upd_level = INTERNAL_COST_UPD_OFF;
    (cpi->sf).tx_sf.model_based_prune_tx_search_level = 0;
    (cpi->sf).lpf_sf.dual_sgr_penalty_level = 1;
    (cpi->sf).lpf_sf.disable_wiener_filter = true;
    (cpi->sf).lpf_sf.disable_sgr_filter = true;
    (cpi->sf).intra_sf.prune_palette_search_level = 2;
    (cpi->sf).intra_sf.prune_luma_palette_size_search_level = 2;
    (cpi->sf).intra_sf.early_term_chroma_palette_size_search = 1;
    (cpi->sf).hl_sf.superres_auto_search_type = '\x02';
    (cpi->sf).hl_sf.frame_parameter_update = 0;
    (cpi->sf).inter_sf.model_based_post_interp_filter_breakout = 1;
    (cpi->sf).inter_sf.prune_mode_search_simple_translation = 0;
    (cpi->sf).inter_sf.prune_ref_frame_for_rect_partitions = (uint)bVar31;
    (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
    (cpi->sf).inter_sf.selective_ref_frame = 4;
    (cpi->sf).inter_sf.alt_ref_search_fp = 2;
    iVar21 = (uint)bVar31 * 4;
    (cpi->sf).inter_sf.txfm_rd_gate_level[0] = iVar21;
    (cpi->sf).inter_sf.txfm_rd_gate_level[1] = iVar21;
    (cpi->sf).inter_sf.txfm_rd_gate_level[2] = iVar21;
    (cpi->sf).inter_sf.limit_txfm_eval_per_mode = 3;
    (cpi->sf).inter_sf.adaptive_rd_thresh = 4;
    (cpi->sf).inter_sf.prune_inter_modes_if_skippable = 1;
    (cpi->sf).inter_sf.inter_mode_rd_model_estimation = 2;
    (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x03';
    (cpi->sf).inter_sf.reduce_inter_modes = (uint)bVar31 + (uint)bVar31 | 1;
    (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
    (cpi->sf).interp_sf.use_fast_interpolation_filter_search = 1;
    (cpi->sf).interp_sf.use_interp_filter = 1;
    (cpi->sf).interp_sf.adaptive_interp_filter_search = 1;
    (cpi->sf).interp_sf.disable_dual_filter = 1;
    (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
    (cpi->sf).part_sf.default_max_partition_size = BLOCK_128X128;
    (cpi->sf).part_sf.use_best_rd_for_pruning = 1;
    (cpi->sf).part_sf.early_term_after_none_split = 1;
    (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x2000000;
    (cpi->sf).part_sf.max_intra_bsize = BLOCK_16X16;
    (cpi->sf).part_sf.partition_search_breakout_rate_thr = 500;
    (cpi->sf).part_sf.partition_search_type = '\x02';
    (cpi->sf).part_sf.adjust_var_based_rd_partitioning = 2;
    (cpi->sf).mv_sf.full_pixel_search_level = 1;
    (cpi->sf).mv_sf.exhaustive_searches_thresh = 0x7fffffff;
    (cpi->sf).mv_sf.auto_mv_step_size = 1;
    (cpi->sf).mv_sf.subpel_iters_per_step = 1;
    (cpi->sf).mv_sf.use_accurate_subpel_search = '\x01';
    (cpi->sf).mv_sf.search_method = '\b';
    (cpi->sf).mv_sf.subpel_force_stop = '\0';
    (cpi->sf).mv_sf.subpel_search_method = '\x01';
    lVar19 = -0x14;
    do {
      *(undefined4 *)((long)(cpi->sf).intra_sf.intra_uv_mode_mask + lVar19) = 1;
      *(undefined4 *)((long)(cpi->sf).intra_sf.intra_uv_mode_mask + lVar19 + 0x14) = 0x2001;
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0);
    (cpi->sf).intra_sf.skip_intra_in_interframe = 5;
    (cpi->sf).intra_sf.disable_smooth_intra = 1;
    (cpi->sf).tx_sf.tx_type_search.use_reduced_intra_txset = 1;
    (cpi->sf).tx_sf.adaptive_txb_search_level = 2;
    (cpi->sf).tx_sf.intra_tx_size_search_init_depth_rect = 1;
    (cpi->sf).tx_sf.tx_size_search_lgr_block = 1;
    (cpi->sf).tx_sf.tx_type_search.skip_tx_search = 1;
    *(undefined8 *)&(cpi->sf).intra_sf.skip_filter_intra_in_inter_frames = 0x100000001;
    (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect = 1;
    (cpi->sf).tx_sf.intra_tx_size_search_init_depth_sqr = 1;
    (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x03';
    (cpi->sf).tx_sf.refine_fast_tx_search_results = 0;
    (cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search = 1;
    (cpi->sf).tx_sf.tx_type_search.use_skip_flag_prediction = 2;
    (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
    (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 4;
    (cpi->sf).rd_sf.optimize_coefficients = '\0';
    (cpi->sf).rd_sf.simple_model_rd_from_var = 1;
    (cpi->sf).rd_sf.tx_domain_dist_level = 2;
    (cpi->sf).rd_sf.tx_domain_dist_thres_level = 2;
    (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
    (cpi->sf).lpf_sf.lpf_pick = '\x03';
    (cpi->sf).winner_mode_sf.dc_blk_pred_level = (uint)((bVar28 & 0xfd) != 0) * 3;
    (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
    (cpi->sf).winner_mode_sf.tx_size_search_level = 1;
    (cpi->sf).winner_mode_sf.winner_mode_ifs = 1;
    (cpi->sf).rt_sf.check_intra_pred_nonrd = 1;
    (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 2;
    (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
    (cpi->sf).rt_sf.ref_frame_comp_nonrd[0] = 0;
    (cpi->sf).rt_sf.ref_frame_comp_nonrd[1] = 0;
    (cpi->sf).rt_sf.ref_frame_comp_nonrd[2] = 0;
    puVar3 = &(cpi->sf).rt_sf.mode_search_skip_flags;
    *(byte *)puVar3 = (byte)*puVar3 | 0x10;
    (cpi->sf).rt_sf.prune_inter_modes_using_temp_var = 1;
    (cpi->sf).rt_sf.use_real_time_ref_set = 1;
    (cpi->sf).rt_sf.short_circuit_low_temp_var = 1;
    (cpi->sf).rt_sf.num_inter_modes_for_tx_search = 5;
    (cpi->sf).rt_sf.use_nonrd_filter_search = 1;
    (cpi->sf).rt_sf.use_simple_rd_model = 1;
    (cpi->sf).rt_sf.hybrid_intra_pickmode = 1;
    (cpi->sf).rt_sf.prune_inter_modes_with_golden_ref = (uint)bVar31;
    (cpi->sf).rt_sf.check_scene_detection = (uint)((cpi->rc).rtc_external_ratectrl == 0);
    bVar28 = (cpi->common).current_frame.frame_type;
    if ((bVar28 != 0) && ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) {
      (cpi->sf).rt_sf.overshoot_detection_cbr = '\x01';
    }
    if (((cpi->oxcf).kf_cfg.key_freq_max != 0) &&
       (0x4b000 < (cpi->common).height * (cpi->common).width)) {
      (cpi->sf).rt_sf.use_temporal_noise_estimate = 1;
    }
    uVar29 = 0x3b;
    if (bVar28 == 0) {
      uVar29 = 0;
    }
    (cpi->sf).rt_sf.skip_tx_no_split_var_based_partition = 1;
    (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 1;
    (cpi->sf).rt_sf.mode_search_skip_flags = uVar29;
    (cpi->sf).rt_sf.var_part_split_threshold_shift = 5;
    if ((bVar28 & 0xfd) != 0) {
      (cpi->sf).rt_sf.var_part_based_on_qidx = 1;
    }
    (cpi->sf).rt_sf.use_fast_fixed_part = 0;
    (cpi->sf).rt_sf.increase_source_sad_thresh = 0;
    if (5 < speed) {
      (cpi->sf).mv_sf.use_fullpel_costlist = 1;
      (cpi->sf).rd_sf.tx_domain_dist_thres_level = 3;
      (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh = 0;
      (cpi->sf).inter_sf.limit_inter_mode_cands = 4;
      (cpi->sf).inter_sf.prune_warped_prob_thresh = 8;
      (cpi->sf).inter_sf.extra_prune_warped = 1;
      (cpi->sf).rt_sf.gf_refresh_based_on_qp = 1;
      (cpi->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 1;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 7;
      if ((bVar28 & 0xfd) != 0) {
        (cpi->sf).rt_sf.var_part_based_on_qidx = 2;
      }
      (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)bVar31 + (uint)bVar31 * 2;
    }
    if (6 < speed) {
      (cpi->sf).rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_1;
      (cpi->sf).rt_sf.use_comp_ref_nonrd = 1;
      (cpi->sf).rt_sf.ref_frame_comp_nonrd[2] = 1;
      (cpi->sf).tx_sf.intra_tx_size_search_init_depth_sqr = 2;
      (cpi->sf).part_sf.partition_search_type = '\x02';
      (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
      (cpi->sf).mv_sf.search_method = '\b';
      (cpi->sf).mv_sf.subpel_force_stop = '\x01';
      (cpi->sf).inter_sf.inter_mode_rd_model_estimation = 2;
      lVar19 = 0;
      (cpi->sf).inter_sf.skip_newmv_in_drl = 0;
      (cpi->sf).interp_sf.skip_interp_filter_search = 0;
      auVar17 = _DAT_004ca1f0;
      auVar37 = _DAT_004ca1e0;
      do {
        if (SUB164(auVar37 ^ auVar17,4) == -0x80000000 && SUB164(auVar37 ^ auVar17,0) < -0x7ffffffb)
        {
          (cpi->sf).intra_sf.intra_y_mode_mask[lVar19] = 0x1fff;
          (cpi->sf).intra_sf.intra_y_mode_mask[lVar19 + 1] = 0x1fff;
        }
        lVar19 = lVar19 + 2;
        lVar38 = auVar37._8_8_;
        auVar37._0_8_ = auVar37._0_8_ + 2;
        auVar37._8_8_ = lVar38 + 2;
      } while (lVar19 != 6);
      (cpi->sf).lpf_sf.lpf_pick = '\x03';
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL5;
      puVar3 = &(cpi->sf).rt_sf.mode_search_skip_flags;
      *(byte *)puVar3 = (byte)*puVar3 | 0x10;
      (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
      (cpi->sf).rt_sf.use_nonrd_pick_mode = 1;
      (cpi->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 0;
      (cpi->sf).rt_sf.prune_inter_modes_using_temp_var = 0;
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_4X4;
      (cpi->sf).rt_sf.reuse_inter_pred_nonrd = (cpi->oxcf).motion_mode_cfg.enable_warped_motion ^ 1;
      (cpi->sf).rt_sf.short_circuit_low_temp_var = 0;
      (cpi->sf).rt_sf.use_nonrd_altref_frame = (uint)((cpi->svc).number_spatial_layers < 2);
      (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 3;
      (cpi->sf).rt_sf.skip_intra_pred = 1;
      (cpi->sf).rt_sf.source_metrics_sb_nonrd = 1;
      uVar23 = 0;
      do {
        iVar21 = 7;
        if (8 < uVar23) {
          iVar21 = 1;
        }
        (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar23] = iVar21;
        uVar23 = uVar23 + 1;
      } while (uVar23 != 0x10);
      (cpi->sf).winner_mode_sf.dc_blk_pred_level = 0;
      (cpi->sf).rt_sf.var_part_based_on_qidx = 3;
      (cpi->sf).rt_sf.prune_compoundmode_with_singlecompound_var = true;
      (cpi->sf).rt_sf.prune_compoundmode_with_singlemode_var = true;
      (cpi->sf).rt_sf.skip_compound_based_on_var = true;
      (cpi->sf).rt_sf.use_adaptive_subpel_search = true;
    }
    if (7 < speed) {
      (cpi->sf).rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_2;
      (cpi->sf).intra_sf.intra_pruning_with_hog = 1;
      (cpi->sf).rt_sf.short_circuit_low_temp_var = 1;
      (cpi->sf).rt_sf.use_nonrd_altref_frame = 0;
      (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 2;
      (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 0;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 8;
      (cpi->sf).rt_sf.var_part_based_on_qidx = 4;
      (cpi->sf).rt_sf.partition_direct_merging = 1;
      (cpi->sf).rt_sf.prune_compoundmode_with_singlemode_var = false;
      (cpi->sf).mv_sf.use_bsize_dependent_search_method = 2;
      (cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad = true;
    }
    if (8 < speed) {
      (cpi->sf).rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_3;
      (cpi->sf).rt_sf.prefer_large_partition_blocks = 3;
      (cpi->sf).rt_sf.skip_intra_pred = 2;
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 3;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 9;
      lVar19 = 0;
      do {
        piVar2 = (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd + lVar19;
        piVar2[0] = 1;
        piVar2[1] = 1;
        piVar2[2] = 1;
        piVar2[3] = 1;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      (cpi->sf).rt_sf.var_part_based_on_qidx = 0;
      (cpi->sf).rt_sf.frame_level_mode_cost_update = true;
      (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = true;
      (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
      (cpi->sf).rt_sf.use_adaptive_subpel_search = true;
      (cpi->sf).mv_sf.use_bsize_dependent_search_method = 0;
    }
    if (9 < speed) {
      (cpi->sf).rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_4;
      (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 3;
      (cpi->sf).rt_sf.var_part_split_threshold_shift = 10;
      (cpi->sf).mv_sf.subpel_search_method = '\x02';
    }
    if ((10 < speed && (bVar28 & 0xfd) != 0) && ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN)
       ) {
      (cpi->sf).winner_mode_sf.dc_blk_pred_level = 3;
    }
  }
  else if (MVar7 == '\0') {
    pAVar13 = cpi->ppi;
    bVar28 = (pAVar13->gf_group).update_type[cpi->gf_frame_index];
    bVar8 = (cpi->common).current_frame.frame_type;
    bVar33 = (bVar8 & 0xfd) == 0;
    bVar34 = (bVar28 & 0xfe) == 2;
    bVar31 = bVar34 || bVar33;
    bVar35 = bVar28 == 6;
    FVar9 = (pAVar13->gf_group).frame_type[cpi->gf_frame_index];
    _Var10 = (cpi->common).features.allow_screen_content_tools;
    _Var11 = (cpi->oxcf).use_highbitdepth;
    if ((cpi->oxcf).tile_cfg.enable_large_scale_tile == false) {
      (cpi->sf).hl_sf.high_precision_mv_usage = '\0';
    }
    uVar32 = (uint)bVar31;
    uVar25 = uVar32 ^ 3;
    (cpi->sf).gm_sf.gm_search_type = (GM_SEARCH_TYPE)uVar25;
    bVar20 = !bVar34 && !bVar33;
    (cpi->sf).gm_sf.prune_ref_frame_for_gm_search = (uint)bVar20;
    (cpi->sf).gm_sf.disable_gm_search_based_on_stats = 1;
    (cpi->sf).part_sf.less_rectangular_check_level = 1;
    (cpi->sf).part_sf.ml_prune_partition = 1;
    (cpi->sf).part_sf.prune_ext_partition_types_search_level = 1;
    (cpi->sf).part_sf.prune_part4_search = 2;
    (cpi->sf).part_sf.simple_motion_search_prune_rect = 1;
    (cpi->sf).part_sf.ml_predict_breakout_level = (uint)(_Var11 ^ 1) * 2 | 1;
    (cpi->sf).part_sf.reuse_prev_rd_results_for_part_ab = 1;
    (cpi->sf).part_sf.use_best_rd_for_pruning = 1;
    uVar29 = (uint)_Var10;
    (cpi->sf).part_sf.simple_motion_search_prune_agg = -uVar29;
    (cpi->sf).inter_sf.inter_mode_rd_model_estimation = 1;
    (cpi->sf).inter_sf.model_based_post_interp_filter_breakout = 1;
    (cpi->sf).inter_sf.prune_mode_search_simple_translation = 1;
    (cpi->sf).inter_sf.prune_compound_using_single_ref = 1;
    iVar30 = 2 - (uint)(bVar35 || bVar31);
    iVar21 = iVar30;
    if ((bVar34 || bVar33) || (_Var10 & 1U) != 0) {
      iVar21 = 0;
    }
    (cpi->sf).inter_sf.prune_ref_frame_for_rect_partitions = iVar21;
    iVar21 = 2 - uVar32;
    (cpi->sf).inter_sf.reduce_inter_modes = iVar21;
    (cpi->sf).inter_sf.selective_ref_frame = 1;
    (cpi->sf).inter_sf.use_dist_wtd_comp_flag = '\x01';
    (cpi->sf).interp_sf.use_fast_interpolation_filter_search = 1;
    (cpi->sf).intra_sf.intra_pruning_with_hog = 1;
    (cpi->sf).tx_sf.adaptive_txb_search_level = 1;
    (cpi->sf).tx_sf.intra_tx_size_search_init_depth_sqr = 1;
    (cpi->sf).tx_sf.model_based_prune_tx_search_level = 1;
    (cpi->sf).tx_sf.tx_type_search.use_reduced_intra_txset = 1;
    (cpi->sf).tpl_sf.search_method = '\x02';
    (cpi->sf).rt_sf.use_nonrd_pick_mode = 0;
    (cpi->sf).rt_sf.use_real_time_ref_set = 0;
    iVar22 = 0x100000;
    if (((cpi->twopass_frame).fr_content_type != '\x01') &&
       (iVar22 = 0x100000, cpi->use_screen_content_tools == 0)) {
      iVar22 = 0x2000000;
    }
    (cpi->sf).mv_sf.exhaustive_searches_thresh = iVar22;
    (cpi->sf).rd_sf.perform_coeff_opt = 1;
    (cpi->sf).hl_sf.superres_auto_search_type = '\x01';
    if (0 < speed) {
      bVar28 = _Var10 ^ 1;
      piVar2 = &(cpi->sf).mv_sf.exhaustive_searches_thresh;
      *piVar2 = *piVar2 << 1;
      (cpi->sf).hl_sf.adjust_num_frames_for_arf_filtering = (uint)bVar28;
      (cpi->sf).part_sf.intra_cnn_based_part_prune_level = (uint)bVar28 + (uint)bVar28;
      (cpi->sf).part_sf.simple_motion_search_early_term_none = 1;
      (cpi->sf).part_sf.simple_motion_search_split = 2 - uVar29;
      (cpi->sf).part_sf.ml_predict_breakout_level = _Var11 ^ 3;
      iVar22 = iVar21;
      if ((_Var10 & 1U) != 0) {
        iVar22 = 0;
      }
      (cpi->sf).mv_sf.obmc_full_pixel_search_level = 1;
      (cpi->sf).mv_sf.use_accurate_subpel_search = '\x02';
      (cpi->sf).mv_sf.disable_extensive_joint_motion_search = 1;
      (cpi->sf).inter_sf.prune_comp_search_by_single_result = uVar32 + 1;
      if ((bVar8 & 0xfd) == 0) {
        iVar22 = 0;
      }
      (cpi->sf).inter_sf.prune_comp_type_by_comp_avg = 1;
      (cpi->sf).inter_sf.prune_comp_type_by_model_rd = (uint)bVar20;
      (cpi->sf).inter_sf.prune_ref_frame_for_rect_partitions = iVar22;
      (cpi->sf).inter_sf.reduce_inter_modes = (uint)bVar20 + (uint)bVar20 | 1;
      (cpi->sf).inter_sf.reuse_inter_intra_mode = 1;
      (cpi->sf).inter_sf.selective_ref_frame = 2;
      (cpi->sf).inter_sf.skip_arf_compound = 1;
      (cpi->sf).interp_sf.use_interp_filter = 1;
      (cpi->sf).intra_sf.prune_palette_search_level = 1;
      (cpi->sf).tx_sf.adaptive_txb_search_level = 2;
      (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr = 1;
      (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect = 1;
      (cpi->sf).tx_sf.intra_tx_size_search_init_depth_rect = 1;
      (cpi->sf).tx_sf.model_based_prune_tx_search_level = 0;
      (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
      (cpi->sf).tx_sf.tx_type_search.skip_tx_search = 1;
      (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x02';
      (cpi->sf).rd_sf.perform_coeff_opt = uVar25;
      (cpi->sf).rd_sf.tx_domain_dist_level = iVar21;
      (cpi->sf).rd_sf.tx_domain_dist_thres_level = 1;
      (cpi->sf).lpf_sf.dual_sgr_penalty_level = 1;
      (cpi->sf).lpf_sf.enable_sgr_ep_pruning = 1;
      (cpi->sf).tpl_sf.skip_alike_starting_mv = 1;
    }
    uVar26 = (uint)bVar20;
    if (1 < speed) {
      (cpi->sf).hl_sf.recode_loop = '\x01';
      (cpi->sf).fp_sf.skip_motion_search_threshold = 0x19;
      (cpi->sf).gm_sf.num_refinement_steps = 2;
      bVar36 = ((cpi->common).current_frame.frame_type & 0xfd) != 0;
      (cpi->sf).part_sf.reuse_best_prediction_for_part_ab = (uint)bVar36;
      (cpi->sf).mv_sf.simple_motion_subpel_force_stop = '\x01';
      (cpi->sf).mv_sf.subpel_iters_per_step = 1;
      (cpi->sf).mv_sf.reduce_search_range = 1;
      (cpi->sf).inter_sf.adaptive_rd_thresh = 1;
      (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 100;
      (cpi->sf).inter_sf.fast_interintra_wedge_search = 1;
      (cpi->sf).inter_sf.prune_comp_search_by_single_result = uVar32 * 3 + 1;
      (cpi->sf).inter_sf.prune_ext_comp_using_neighbors = 1;
      (cpi->sf).inter_sf.prune_comp_using_best_single_mode_ref = 2;
      (cpi->sf).inter_sf.prune_comp_type_by_comp_avg = 2;
      (cpi->sf).inter_sf.selective_ref_frame = 3;
      (cpi->sf).inter_sf.use_dist_wtd_comp_flag = '\x02';
      (cpi->sf).inter_sf.enable_fast_compound_mode_search = 1;
      (cpi->sf).inter_sf.reuse_mask_search_results = 1;
      uVar27 = (uint)bVar20;
      (cpi->sf).inter_sf.txfm_rd_gate_level[0] = uVar27;
      (cpi->sf).inter_sf.txfm_rd_gate_level[1] = uVar27;
      (cpi->sf).inter_sf.txfm_rd_gate_level[2] = uVar27;
      (cpi->sf).inter_sf.inter_mode_txfm_breakout = uVar27;
      (cpi->sf).inter_sf.alt_ref_search_fp = 1;
      (cpi->sf).interp_sf.adaptive_interp_filter_search = 1;
      (cpi->sf).interp_sf.disable_dual_filter = 1;
      uVar27 = 1;
      if (!bVar36) {
        uVar27 = (uint)(1 < (cpi->rc).frames_to_key);
      }
      (cpi->sf).intra_sf.disable_smooth_intra = uVar27;
      (cpi->sf).intra_sf.intra_pruning_with_hog = 2;
      (cpi->sf).intra_sf.skip_intra_in_interframe = (FVar9 == '\x01') + 1;
      (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames = 1;
      (cpi->sf).tpl_sf.prune_starting_mv = 1;
      (cpi->sf).tpl_sf.search_method = '\0';
      (cpi->sf).rd_sf.perform_coeff_opt = 4 - (uint)(bVar35 || bVar31);
      (cpi->sf).rd_sf.use_mb_rd_hash = 1;
      (cpi->sf).lpf_sf.prune_wiener_based_on_src_var = 1;
      (cpi->sf).lpf_sf.prune_sgr_based_on_wiener = 1;
      (cpi->sf).lpf_sf.disable_loop_restoration_chroma = uVar26;
      (cpi->sf).lpf_sf.reduce_wiener_window_size = uVar26;
      (cpi->sf).tpl_sf.prune_ref_frames_in_tpl = 1;
      (cpi->sf).tpl_sf.allow_compound_pred = 0;
    }
    if (2 < speed) {
      (cpi->sf).hl_sf.high_precision_mv_usage = '\x01';
      (cpi->sf).gm_sf.prune_ref_frame_for_gm_search = 1;
      (cpi->sf).gm_sf.prune_zero_mv_with_sse = 1;
      iVar22 = 0;
      (cpi->sf).gm_sf.num_refinement_steps = 0;
      (cpi->sf).part_sf.less_rectangular_check_level = 2;
      iVar21 = (uint)(!bVar34 && !bVar33) * 3 + 1;
      if (_Var10 != false) {
        iVar21 = iVar22;
      }
      (cpi->sf).part_sf.simple_motion_search_prune_agg = iVar21;
      (cpi->sf).part_sf.prune_ext_part_using_split_info = 1;
      (cpi->sf).part_sf.simple_motion_search_rect_split = 1;
      (cpi->sf).mv_sf.full_pixel_search_level = 1;
      (cpi->sf).mv_sf.use_intrabc = 0;
      (cpi->sf).mv_sf.subpel_search_method = '\x01';
      (cpi->sf).mv_sf.search_method = '\0';
      (cpi->sf).mv_sf.disable_second_mv = 2;
      (cpi->sf).mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_LVL_1;
      (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search = uVar26;
      (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
      (cpi->sf).inter_sf.disable_onesided_comp = 1;
      (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
      (cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma = 1;
      (cpi->sf).inter_sf.prune_inter_modes_based_on_tpl = uVar26;
      (cpi->sf).inter_sf.prune_comp_search_by_single_result = uVar32 * 2 + 2;
      (cpi->sf).inter_sf.selective_ref_frame = 5;
      (cpi->sf).inter_sf.reuse_compound_type_decision = 1;
      iVar21 = 0;
      if (bVar34 || bVar33) {
        iVar30 = 0;
      }
      (cpi->sf).inter_sf.txfm_rd_gate_level[0] = iVar30;
      (cpi->sf).inter_sf.txfm_rd_gate_level[1] = iVar30;
      (cpi->sf).inter_sf.txfm_rd_gate_level[2] = iVar30;
      (cpi->sf).inter_sf.inter_mode_txfm_breakout = (uint)(!bVar34 && !bVar33) * 2;
      (cpi->sf).interp_sf.adaptive_interp_filter_search = 2;
      (cpi->sf).intra_sf.intra_pruning_with_hog = 3;
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 2;
      (cpi->sf).intra_sf.prune_palette_search_level = 2;
      (cpi->sf).intra_sf.top_intra_model_count_allowed = 2;
      (cpi->sf).tpl_sf.prune_starting_mv = 2;
      (cpi->sf).tpl_sf.skip_alike_starting_mv = 2;
      (cpi->sf).tpl_sf.prune_intra_modes = 1;
      (cpi->sf).tpl_sf.reduce_first_step_size = 6;
      (cpi->sf).tpl_sf.subpel_force_stop = '\x01';
      (cpi->sf).tpl_sf.gop_length_decision_method = 1;
      (cpi->sf).tx_sf.adaptive_txb_search_level = uVar25;
      (cpi->sf).tx_sf.tx_type_search.use_skip_flag_prediction = 2;
      (cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode = '\x03';
      (cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt = 1;
      (cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist = 1;
      if (!bVar34 && !bVar33) {
        iVar21 = ((pAVar13->gf_group).update_type[cpi->gf_frame_index] != '\x06') + 1;
        iVar22 = 4;
      }
      (cpi->sf).winner_mode_sf.motion_mode_for_winner_cand = iVar21;
      (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = iVar22;
      (cpi->sf).lpf_sf.prune_sgr_based_on_wiener = 2 - uVar29;
      (cpi->sf).lpf_sf.prune_wiener_based_on_src_var = 2;
      (cpi->sf).lpf_sf.use_coarse_filter_level_search =
           (uint)(((cpi->common).current_frame.frame_type & 0xfd) != 0);
      (cpi->sf).lpf_sf.use_downsampled_wiener_stats = 1;
    }
    if (3 < speed) {
      (cpi->sf).mv_sf.subpel_search_method = '\x02';
      (cpi->sf).gm_sf.prune_zero_mv_with_sse = 2;
      (cpi->sf).gm_sf.downsample_level = 1;
      (cpi->sf).part_sf.simple_motion_search_prune_agg = (uint)(_Var10 ^ 1) * 2;
      (cpi->sf).part_sf.simple_motion_search_reduce_search_steps = 4;
      (cpi->sf).part_sf.prune_ext_part_using_split_info = 2;
      (cpi->sf).part_sf.ml_predict_breakout_level = 3;
      uVar25 = 0;
      if (_Var10 == false) {
        uVar25 = (uint)(((cpi->common).current_frame.frame_type & 0xfd) != 0);
      }
      (cpi->sf).part_sf.prune_rectangular_split_based_on_qidx = uVar25;
      (cpi->sf).inter_sf.alt_ref_search_fp = 2;
      iVar21 = (uint)bVar20 + (uint)bVar20 * 2;
      (cpi->sf).inter_sf.txfm_rd_gate_level[0] = iVar21;
      (cpi->sf).inter_sf.txfm_rd_gate_level[1] = (uint)bVar20 + (uint)bVar20 * 4;
      (cpi->sf).inter_sf.txfm_rd_gate_level[2] = iVar21;
      (cpi->sf).inter_sf.prune_inter_modes_based_on_tpl = (uint)bVar20 + (uint)bVar20;
      (cpi->sf).inter_sf.prune_ext_comp_using_neighbors = 2;
      (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x7fffffff;
      (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
      (cpi->sf).interp_sf.cb_pred_filter_search = 1;
      (cpi->sf).interp_sf.use_interp_filter = 2;
      (cpi->sf).interp_sf.skip_sharp_interp_filter_search = 1;
      (cpi->sf).intra_sf.intra_uv_mode_mask[2] = 0x2007;
      (cpi->sf).intra_sf.intra_uv_mode_mask[3] = 0x2007;
      *(undefined8 *)((cpi->sf).intra_sf.intra_uv_mode_mask + 4) = 0x400002007;
      (cpi->sf).mv_sf.simple_motion_subpel_force_stop = '\x02';
      (cpi->sf).mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_LVL_2;
      (cpi->sf).tpl_sf.subpel_force_stop = '\x02';
      (cpi->sf).tpl_sf.search_method = '\t';
      (cpi->sf).tpl_sf.use_sad_for_mode_decision = 1;
      (cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search = 1;
      (cpi->sf).rd_sf.perform_coeff_opt = (uint)(!bVar35 && (!bVar34 && !bVar33)) * 2 + 5;
      (cpi->sf).winner_mode_sf.multi_winner_mode_type =
           (((cpi->common).current_frame.frame_type & 0xfd) == 0) * '\x02';
      (cpi->sf).winner_mode_sf.dc_blk_pred_level = (uint)bVar20 + (uint)bVar20;
      (cpi->sf).lpf_sf.lpf_pick = '\x01';
    }
    if (4 < speed) {
      (cpi->sf).hl_sf.weight_calc_level_in_tf = 1;
      bVar28 = _Var10 ^ 1;
      (cpi->sf).hl_sf.adjust_num_frames_for_arf_filtering = (uint)bVar28 + (uint)bVar28;
      (cpi->sf).fp_sf.reduce_mv_step_param = 4;
      (cpi->sf).part_sf.simple_motion_search_prune_agg = (uint)bVar28 + (uint)bVar28 * 2;
      (cpi->sf).part_sf.ext_partition_eval_thresh = (_Var10 == false) * '\x03' + BLOCK_8X8;
      (cpi->sf).part_sf.prune_sub_8x8_partition_level = 2 - uVar29;
      (cpi->sf).mv_sf.warp_search_method = '\0';
      (cpi->sf).inter_sf.prune_inter_modes_if_skippable = 1;
      (cpi->sf).inter_sf.prune_single_ref = (uint)(!bVar35 && (!bVar34 && !bVar33));
      (cpi->sf).inter_sf.txfm_rd_gate_level[0] = (uint)bVar20 * 4;
      (cpi->sf).inter_sf.txfm_rd_gate_level[2] = (uint)bVar20 + (uint)bVar20 * 4;
      (cpi->sf).inter_sf.enable_fast_compound_mode_search = 2;
      (cpi->sf).interp_sf.skip_interp_filter_search = uVar26;
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 3;
      (cpi->sf).winner_mode_sf.multi_winner_mode_type =
           ((cpi->common).current_frame.frame_type & 0xfd) == 0;
      (cpi->sf).lpf_sf.disable_sgr_filter = true;
      (cpi->sf).lpf_sf.disable_wiener_coeff_refine_search = true;
      (cpi->sf).tpl_sf.prune_starting_mv = 3;
      (cpi->sf).tpl_sf.use_y_only_rate_distortion = 1;
      (cpi->sf).tpl_sf.subpel_force_stop = '\x03';
      (cpi->sf).tpl_sf.gop_length_decision_method = 2;
      (cpi->sf).tpl_sf.use_sad_for_mode_decision = 2;
      (cpi->sf).winner_mode_sf.dc_blk_pred_level = 2;
      (cpi->sf).fp_sf.disable_recon = 1;
    }
    if (5 < speed) {
      (cpi->sf).hl_sf.disable_extra_sc_testing = 1;
      (cpi->sf).hl_sf.second_alt_ref_filtering = 0;
      (cpi->sf).gm_sf.downsample_level = 2;
      (cpi->sf).inter_sf.prune_inter_modes_based_on_tpl = (uint)bVar20 + (uint)bVar20 * 2;
      (cpi->sf).inter_sf.selective_ref_frame = 6;
      bVar33 = !bVar35 && (!bVar34 && !bVar33);
      (cpi->sf).inter_sf.prune_single_ref = (uint)bVar33 + (uint)bVar33;
      (cpi->sf).inter_sf.prune_ext_comp_using_neighbors = 3;
      (cpi->sf).intra_sf.intra_pruning_with_hog = 4;
      (cpi->sf).intra_sf.chroma_intra_pruning_with_hog = 4;
      (cpi->sf).intra_sf.intra_uv_mode_mask[3] = 1;
      (cpi->sf).intra_sf.intra_uv_mode_mask[4] = 1;
      (cpi->sf).intra_sf.intra_y_mode_mask[3] = 1;
      (cpi->sf).intra_sf.intra_y_mode_mask[4] = 1;
      (cpi->sf).intra_sf.early_term_chroma_palette_size_search = 1;
      (cpi->sf).part_sf.prune_rectangular_split_based_on_qidx = ((byte)~(bVar31 | _Var10) & 1) * 2;
      (cpi->sf).part_sf.prune_part4_search = 3;
      (cpi->sf).mv_sf.simple_motion_subpel_force_stop = '\x03';
      (cpi->sf).mv_sf.use_bsize_dependent_search_method = 1;
      (cpi->sf).tpl_sf.gop_length_decision_method = 3;
      (cpi->sf).rd_sf.perform_coeff_opt = bVar33 + 6 + (uint)bVar33;
      (cpi->sf).winner_mode_sf.dc_blk_pred_level = 3;
      (cpi->sf).winner_mode_sf.multi_winner_mode_type = '\0';
      (cpi->sf).fp_sf.skip_zeromv_motion_search = 1;
    }
    if ((cpi->oxcf).enable_low_complexity_decode != 0) {
      (cpi->sf).lpf_sf.adaptive_luma_loop_filter_skip =
           (uint)((byte)((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] - 6) < 0xfe);
    }
  }
  if (((cpi->oxcf).txfm_cfg.enable_tx_size_search == false) &&
     ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    (cpi->sf).winner_mode_sf.tx_size_search_level = 3;
  }
  iVar21 = (cpi->mt_info).num_workers;
  if (4 < speed && 1 < iVar21) {
    (cpi->sf).lpf_sf.disable_wiener_filter = true;
    (cpi->sf).lpf_sf.disable_sgr_filter = true;
  }
  pAVar13 = cpi->ppi;
  if (pAVar13->seq_params_locked == 0) {
    pSVar14 = (cpi->common).seq_params;
    uVar29 = (pSVar14->order_hint_info).enable_dist_wtd_comp & 1;
    if ((cpi->sf).inter_sf.use_dist_wtd_comp_flag == '\x02') {
      uVar29 = 0;
    }
    (pSVar14->order_hint_info).enable_dist_wtd_comp = uVar29;
    pSVar14->enable_dual_filter =
         pSVar14->enable_dual_filter & (cpi->sf).interp_sf.disable_dual_filter == 0;
    bVar28 = 1;
    if ((cpi->sf).lpf_sf.disable_wiener_filter == true) {
      bVar28 = (cpi->sf).lpf_sf.disable_sgr_filter ^ 1;
    }
    pSVar14->enable_restoration = pSVar14->enable_restoration & bVar28;
    bVar28 = pSVar14->enable_interintra_compound & 1;
    if ((cpi->sf).inter_sf.disable_interintra_wedge_var_thresh == 0xffffffff) {
      bVar28 = 0;
    }
    pSVar14->enable_interintra_compound = bVar28;
  }
  iVar30 = 5;
  if (speed < 5) {
    iVar30 = speed;
  }
  lVar19 = 0;
  do {
    MVar15 = good_quality_mesh_patterns[iVar30][lVar19 + 1];
    pMVar6 = (cpi->sf).mv_sf.mesh_patterns + lVar19;
    *pMVar6 = good_quality_mesh_patterns[iVar30][lVar19];
    pMVar6[1] = MVar15;
    lVar19 = lVar19 + 2;
  } while (lVar19 != 4);
  lVar19 = 0;
  do {
    MVar15 = intrabc_mesh_patterns[iVar30][lVar19 + 1];
    pMVar6 = (cpi->sf).mv_sf.intrabc_mesh_patterns + lVar19;
    *pMVar6 = intrabc_mesh_patterns[iVar30][lVar19];
    pMVar6[1] = MVar15;
    lVar19 = lVar19 + 2;
  } while (lVar19 != 4);
  aVar12 = (cpi->oxcf).pass;
  if ((aVar12 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) {
    (cpi->sf).rd_sf.optimize_coefficients = '\0';
  }
  if ((aVar12 == AOM_RC_ONE_PASS) && (pAVar13->lap_enabled == 0)) {
    (cpi->sf).hl_sf.recode_loop = '\0';
  }
  uVar29 = (cpi->oxcf).unit_test_cfg.motion_vector_unit_test;
  (cpi->mv_search_params).find_fractional_mv_step =
       fractional_mv_search[(cpi->sf).mv_sf.subpel_search_method];
  if (uVar29 == 1) {
    pcVar24 = av1_return_max_sub_pixel_mv;
  }
  else {
    if (uVar29 != 2) goto LAB_00229383;
    pcVar24 = av1_return_min_sub_pixel_mv;
  }
  (cpi->mv_search_params).find_fractional_mv_step = pcVar24;
LAB_00229383:
  iVar30 = (cpi->sf).rd_sf.tx_domain_dist_thres_level;
  *(undefined8 *)(cpi->winner_mode_params).tx_domain_dist_threshold =
       *(undefined8 *)tx_domain_dist_thresholds[iVar30];
  (cpi->winner_mode_params).tx_domain_dist_threshold[2] = tx_domain_dist_thresholds[iVar30][2];
  iVar30 = (cpi->sf).rd_sf.tx_domain_dist_level;
  *(undefined8 *)(cpi->winner_mode_params).use_transform_domain_distortion =
       *(undefined8 *)tx_domain_dist_types[iVar30];
  (cpi->winner_mode_params).use_transform_domain_distortion[2] = tx_domain_dist_types[iVar30][2];
  iVar30 = (cpi->sf).rd_sf.perform_coeff_opt;
  auVar16 = coeff_opt_thresholds[iVar30][1];
  (cpi->winner_mode_params).coeff_opt_thresholds[0] = coeff_opt_thresholds[iVar30][0];
  (cpi->winner_mode_params).coeff_opt_thresholds[1] = auVar16;
  (cpi->winner_mode_params).coeff_opt_thresholds[2] = coeff_opt_thresholds[iVar30][2];
  iVar30 = (cpi->sf).tx_sf.tx_type_search.use_skip_flag_prediction;
  *(undefined8 *)(cpi->winner_mode_params).skip_txfm_level =
       *(undefined8 *)predict_skip_levels[iVar30];
  (cpi->winner_mode_params).skip_txfm_level[2] = predict_skip_levels[iVar30][2];
  iVar30 = (cpi->sf).winner_mode_sf.tx_size_search_level;
  (cpi->winner_mode_params).tx_size_search_methods[2] = tx_size_search_methods[iVar30][2];
  *(undefined2 *)(cpi->winner_mode_params).tx_size_search_methods =
       *(undefined2 *)tx_size_search_methods[iVar30];
  iVar30 = (cpi->sf).winner_mode_sf.dc_blk_pred_level;
  (cpi->winner_mode_params).predict_dc_level[2] = predict_dc_levels[iVar30][2];
  *(undefined8 *)(cpi->winner_mode_params).predict_dc_level =
       *(undefined8 *)predict_dc_levels[iVar30];
  if ((1 < iVar21) && ((cpi->oxcf).row_mt != false)) {
    if (pIVar1->inter_mode_rd_model_estimation == 1) {
      pIVar1->inter_mode_rd_model_estimation = 2;
    }
    uVar23 = (ulong)(cpi->sf).gm_sf.gm_search_type;
    if ((uVar23 != 4) && (gm_available_reference_frames[uVar23] <= iVar21)) {
      (cpi->sf).gm_sf.prune_ref_frame_for_gm_search = 0;
    }
  }
  if ((cpi->oxcf).rc_cfg.gf_cbr_boost_pct != 0) {
    (cpi->sf).rt_sf.gf_refresh_based_on_qp = 0;
  }
  return;
}

Assistant:

void av1_set_speed_features_framesize_independent(AV1_COMP *cpi, int speed) {
  SPEED_FEATURES *const sf = &cpi->sf;
  WinnerModeParams *const winner_mode_params = &cpi->winner_mode_params;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  int i;

  init_hl_sf(&sf->hl_sf);
  init_fp_sf(&sf->fp_sf);
  init_tpl_sf(&sf->tpl_sf);
  init_gm_sf(&sf->gm_sf);
  init_part_sf(&sf->part_sf);
  init_mv_sf(&sf->mv_sf);
  init_inter_sf(&sf->inter_sf);
  init_interp_sf(&sf->interp_sf);
  init_intra_sf(&sf->intra_sf);
  init_tx_sf(&sf->tx_sf);
  init_rd_sf(&sf->rd_sf, oxcf);
  init_winner_mode_sf(&sf->winner_mode_sf);
  init_lpf_sf(&sf->lpf_sf);
  init_rt_sf(&sf->rt_sf);

  switch (oxcf->mode) {
    case GOOD:
      set_good_speed_features_framesize_independent(cpi, sf, speed);
      break;
    case ALLINTRA:
      set_allintra_speed_features_framesize_independent(cpi, sf, speed);
      break;
    case REALTIME:
      set_rt_speed_features_framesize_independent(cpi, sf, speed);
      break;
  }

  // Note: when use_nonrd_pick_mode is true, the transform size is the
  // minimum of 16x16 and the largest possible size of the current block,
  // which conflicts with the speed feature "enable_tx_size_search".
  if (!oxcf->txfm_cfg.enable_tx_size_search &&
      sf->rt_sf.use_nonrd_pick_mode == 0) {
    sf->winner_mode_sf.tx_size_search_level = 3;
  }

  if (cpi->mt_info.num_workers > 1) {
    // Loop restoration stage is conditionally disabled for speed 5, 6 when
    // num_workers > 1. Since av1_pick_filter_restoration() is not
    // multi-threaded, enabling the Loop restoration stage will cause an
    // increase in encode time (3% to 7% increase depends on frame
    // resolution).
    // TODO(aomedia:3446): Implement multi-threading of
    // av1_pick_filter_restoration() and enable Wiener filter for speed 5, 6
    // similar to single thread encoding path.
    if (speed >= 5) {
      sf->lpf_sf.disable_sgr_filter = true;
      sf->lpf_sf.disable_wiener_filter = true;
    }
  }

  if (!cpi->ppi->seq_params_locked) {
    cpi->common.seq_params->order_hint_info.enable_dist_wtd_comp &=
        (sf->inter_sf.use_dist_wtd_comp_flag != DIST_WTD_COMP_DISABLED);
    cpi->common.seq_params->enable_dual_filter &=
        !sf->interp_sf.disable_dual_filter;
    // Set the flag 'enable_restoration', if one the Loop restoration filters
    // (i.e., Wiener or Self-guided) is enabled.
    cpi->common.seq_params->enable_restoration &=
        (!sf->lpf_sf.disable_wiener_filter || !sf->lpf_sf.disable_sgr_filter);

    cpi->common.seq_params->enable_interintra_compound &=
        (sf->inter_sf.disable_interintra_wedge_var_thresh != UINT_MAX);
  }

  const int mesh_speed = AOMMIN(speed, MAX_MESH_SPEED);
  for (i = 0; i < MAX_MESH_STEP; ++i) {
    sf->mv_sf.mesh_patterns[i].range =
        good_quality_mesh_patterns[mesh_speed][i].range;
    sf->mv_sf.mesh_patterns[i].interval =
        good_quality_mesh_patterns[mesh_speed][i].interval;
  }

  // Update the mesh pattern of exhaustive motion search for intraBC
  // Though intraBC mesh pattern is populated for all frame types, it is used
  // only for intra frames of screen contents
  for (i = 0; i < MAX_MESH_STEP; ++i) {
    sf->mv_sf.intrabc_mesh_patterns[i].range =
        intrabc_mesh_patterns[mesh_speed][i].range;
    sf->mv_sf.intrabc_mesh_patterns[i].interval =
        intrabc_mesh_patterns[mesh_speed][i].interval;
  }

  // Slow quant, dct and trellis not worthwhile for first pass
  // so make sure they are always turned off.
  if (is_stat_generation_stage(cpi))
    sf->rd_sf.optimize_coefficients = NO_TRELLIS_OPT;

  // No recode for 1 pass.
  if (oxcf->pass == AOM_RC_ONE_PASS && has_no_stats_stage(cpi))
    sf->hl_sf.recode_loop = DISALLOW_RECODE;

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  // assert ensures that tx_domain_dist_level is accessed correctly
  assert(cpi->sf.rd_sf.tx_domain_dist_thres_level >= 0 &&
         cpi->sf.rd_sf.tx_domain_dist_thres_level < 4);
  memcpy(winner_mode_params->tx_domain_dist_threshold,
         tx_domain_dist_thresholds[cpi->sf.rd_sf.tx_domain_dist_thres_level],
         sizeof(winner_mode_params->tx_domain_dist_threshold));

  assert(cpi->sf.rd_sf.tx_domain_dist_level >= 0 &&
         cpi->sf.rd_sf.tx_domain_dist_level < TX_DOMAIN_DIST_LEVELS);
  memcpy(winner_mode_params->use_transform_domain_distortion,
         tx_domain_dist_types[cpi->sf.rd_sf.tx_domain_dist_level],
         sizeof(winner_mode_params->use_transform_domain_distortion));

  // assert ensures that coeff_opt_thresholds is accessed correctly
  assert(cpi->sf.rd_sf.perform_coeff_opt >= 0 &&
         cpi->sf.rd_sf.perform_coeff_opt < 9);
  memcpy(winner_mode_params->coeff_opt_thresholds,
         &coeff_opt_thresholds[cpi->sf.rd_sf.perform_coeff_opt],
         sizeof(winner_mode_params->coeff_opt_thresholds));

  // assert ensures that predict_skip_levels is accessed correctly
  assert(cpi->sf.tx_sf.tx_type_search.use_skip_flag_prediction >= 0 &&
         cpi->sf.tx_sf.tx_type_search.use_skip_flag_prediction < 3);
  memcpy(winner_mode_params->skip_txfm_level,
         predict_skip_levels[cpi->sf.tx_sf.tx_type_search
                                 .use_skip_flag_prediction],
         sizeof(winner_mode_params->skip_txfm_level));

  // assert ensures that tx_size_search_level is accessed correctly
  assert(cpi->sf.winner_mode_sf.tx_size_search_level >= 0 &&
         cpi->sf.winner_mode_sf.tx_size_search_level <= 3);
  memcpy(winner_mode_params->tx_size_search_methods,
         tx_size_search_methods[cpi->sf.winner_mode_sf.tx_size_search_level],
         sizeof(winner_mode_params->tx_size_search_methods));
  memcpy(winner_mode_params->predict_dc_level,
         predict_dc_levels[cpi->sf.winner_mode_sf.dc_blk_pred_level],
         sizeof(winner_mode_params->predict_dc_level));

  if (cpi->oxcf.row_mt == 1 && (cpi->mt_info.num_workers > 1)) {
    if (sf->inter_sf.inter_mode_rd_model_estimation == 1) {
      // Revert to type 2
      sf->inter_sf.inter_mode_rd_model_estimation = 2;
    }

#if !CONFIG_FPMT_TEST
    // Disable the speed feature 'prune_ref_frame_for_gm_search' to achieve
    // better parallelism when number of threads available are greater than or
    // equal to maximum number of reference frames allowed for global motion.
    if (sf->gm_sf.gm_search_type != GM_DISABLE_SEARCH &&
        (cpi->mt_info.num_workers >=
         gm_available_reference_frames[sf->gm_sf.gm_search_type]))
      sf->gm_sf.prune_ref_frame_for_gm_search = 0;
#endif
  }

  // This only applies to the real time mode. Adaptive gf refresh is disabled if
  // gf_cbr_boost_pct that is set by the user is larger than 0.
  if (cpi->oxcf.rc_cfg.gf_cbr_boost_pct > 0)
    sf->rt_sf.gf_refresh_based_on_qp = 0;
}